

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_generator.cc
# Opt level: O0

void __thiscall re2::StringGenerator::Random(StringGenerator *this,int32 seed,int n)

{
  ACMRandom *this_00;
  int n_local;
  int32 seed_local;
  StringGenerator *this_local;
  
  if (this->acm_ == (ACMRandom *)0x0) {
    this_00 = (ACMRandom *)operator_new(4);
    ACMRandom::ACMRandom(this_00,seed);
    this->acm_ = this_00;
  }
  else {
    ACMRandom::Reset(this->acm_,seed);
  }
  this->random_ = true;
  this->nrandom_ = n;
  this->hasnext_ = 0 < this->nrandom_;
  return;
}

Assistant:

void StringGenerator::Random(int32 seed, int n) {
  if (acm_ == NULL)
    acm_ = new ACMRandom(seed);
  else
    acm_->Reset(seed);

  random_ = true;
  nrandom_ = n;
  hasnext_ = nrandom_ > 0;
}